

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aas_test.cc
# Opt level: O0

int test_update_access_key_status_for_account(void)

{
  code *pcVar1;
  char *__s;
  AasUpdateAccessKeyStatusForAccountRequestType *pAVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_189;
  int ret;
  HttpTestListener *local_168;
  HttpTestListener *listener;
  string local_158;
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [55];
  allocator<char> local_d1;
  string local_d0 [32];
  AasUpdateAccessKeyStatusForAccountRequestType *local_b0;
  Aas *aas;
  AasUpdateAccessKeyStatusForAccountResponseType resp;
  AasUpdateAccessKeyStatusForAccountRequestType req;
  
  aliyun::AasUpdateAccessKeyStatusForAccountRequestType::
  AasUpdateAccessKeyStatusForAccountRequestType
            ((AasUpdateAccessKeyStatusForAccountRequestType *)((long)&resp.result.field_2 + 8));
  aliyun::AasUpdateAccessKeyStatusForAccountResponseType::
  AasUpdateAccessKeyStatusForAccountResponseType
            ((AasUpdateAccessKeyStatusForAccountResponseType *)&aas);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"cn-hangzhou",&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"my_appid",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"my_secret",&local_131);
  pAVar2 = (AasUpdateAccessKeyStatusForAccountRequestType *)
           aliyun::Aas::CreateAasClient(local_d0,local_108,local_130);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  local_b0 = pAVar2;
  if (pAVar2 == (AasUpdateAccessKeyStatusForAccountRequestType *)0x0) {
    aliyun::AasUpdateAccessKeyStatusForAccountResponseType::
    ~AasUpdateAccessKeyStatusForAccountResponseType
              ((AasUpdateAccessKeyStatusForAccountResponseType *)&aas);
    aliyun::AasUpdateAccessKeyStatusForAccountRequestType::
    ~AasUpdateAccessKeyStatusForAccountRequestType
              ((AasUpdateAccessKeyStatusForAccountRequestType *)((long)&resp.result.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Aas::SetProxyHost((Aas *)pAVar2,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Aas::SetUseTls((Aas *)local_b0,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_update_access_key_status_for_account_response;
  local_168 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_189);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_189);
  HttpTestListener::Start(local_168);
  std::__cxx11::string::operator=((string *)(resp.result.field_2._M_local_buf + 8),"PK");
  std::__cxx11::string::operator=((string *)(req.pk.field_2._M_local_buf + 8),"AKId");
  std::__cxx11::string::operator=((string *)(req.ak_id.field_2._M_local_buf + 8),"AKStatus");
  aliyun::Aas::UpdateAccessKeyStatusForAccount
            (local_b0,(AasUpdateAccessKeyStatusForAccountResponseType *)
                      ((long)&resp.result.field_2 + 8),(AasErrorInfo *)&aas);
  HttpTestListener::WaitComplete(local_168);
  pHVar3 = local_168;
  if (local_168 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_168);
    operator_delete(pHVar3,0x180);
  }
  pAVar2 = local_b0;
  if (local_b0 != (AasUpdateAccessKeyStatusForAccountRequestType *)0x0) {
    aliyun::Aas::~Aas((Aas *)local_b0);
    operator_delete(pAVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_update_access_key_status_for_account() {
  AasUpdateAccessKeyStatusForAccountRequestType req;
  AasUpdateAccessKeyStatusForAccountResponseType resp;
  Aas* aas = Aas::CreateAasClient("cn-hangzhou", "my_appid", "my_secret");
  if(!aas) return 0;
  aas->SetProxyHost("127.0.0.1:12234");
  aas->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_update_access_key_status_for_account_response);
  listener->Start();
  req.pk = "PK";
  req.ak_id = "AKId";
  req.ak_status = "AKStatus";
  int ret = aas->UpdateAccessKeyStatusForAccount(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete aas;
}